

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngtest.c
# Opt level: O1

void pngtest_warning(png_structp png_ptr,png_const_charp message)

{
  long *plVar1;
  char *pcVar2;
  
  plVar1 = (long *)png_get_error_ptr();
  warning_count = warning_count + 1;
  if (plVar1 == (long *)0x0) {
    pcVar2 = "UNKNOWN (ERROR!)";
  }
  else {
    pcVar2 = "UNKNOWN (ERROR!)";
    if ((char *)*plVar1 != (char *)0x0) {
      pcVar2 = (char *)*plVar1;
    }
  }
  fprintf(_stdout,"\n%s: libpng warning: %s\n",pcVar2,message);
  return;
}

Assistant:

static void PNGCBAPI
pngtest_warning(png_structp png_ptr, png_const_charp message)
{
   const char *name = "UNKNOWN (ERROR!)";
   pngtest_error_parameters *test =
      (pngtest_error_parameters*)png_get_error_ptr(png_ptr);

   ++warning_count;

   if (test != NULL && test->file_name != NULL)
      name = test->file_name;

   fprintf(STDERR, "\n%s: libpng warning: %s\n", name, message);
}